

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

int32 best_rem_score(ps_astar_t *nbest,ps_latnode_t *from)

{
  latlink_list_t *plVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  latlink_list_t **pplVar5;
  int32 n_used;
  int32 local_34;
  
  iVar3 = (from->info).fanin;
  if (0 < iVar3) {
    iVar3 = -0x20000000;
    pplVar5 = &from->exits;
    while (plVar1 = *pplVar5, plVar1 != (latlink_list_t *)0x0) {
      iVar2 = best_rem_score(nbest,plVar1->link->to);
      iVar4 = iVar2 + plVar1->link->ascr;
      if (nbest->lmset != (ngram_model_t *)0x0) {
        iVar2 = ngram_bg_score(nbest->lmset,plVar1->link->to->basewid,from->basewid,&local_34);
        iVar4 = (int)((float)(iVar2 >> 10) * (float)nbest->lwf + (float)iVar4);
      }
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      pplVar5 = &plVar1->next;
    }
    (from->info).fanin = iVar3;
  }
  return iVar3;
}

Assistant:

static int32
best_rem_score(ps_astar_t *nbest, ps_latnode_t * from)
{
    latlink_list_t *x;
    int32 bestscore, score;

    if (from->info.rem_score <= 0)
        return (from->info.rem_score);

    /* Best score from "from" to end of utt not known; compute from successors */
    bestscore = WORST_SCORE;
    for (x = from->exits; x; x = x->next) {
        int32 n_used;

        score = best_rem_score(nbest, x->link->to);
        score += x->link->ascr;
        if (nbest->lmset)
            score += (ngram_bg_score(nbest->lmset, x->link->to->basewid,
                                     from->basewid, &n_used) >> SENSCR_SHIFT)
                      * nbest->lwf;
        if (score BETTER_THAN bestscore)
            bestscore = score;
    }
    from->info.rem_score = bestscore;

    return bestscore;
}